

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O3

TiXmlString * __thiscall
despot::util::tinyxml::TiXmlString::assign(TiXmlString *this,char *str,size_type len)

{
  ulong uVar1;
  Rep *pRVar2;
  Rep *pRVar3;
  
  uVar1 = this->rep_->capacity;
  if (len <= uVar1) {
    if (uVar1 <= len * 3 + 0x18) {
      memmove(this->rep_->str,str,len);
      pRVar3 = this->rep_;
      pRVar3->size = len;
      pRVar3->str[len] = '\0';
      return this;
    }
    if (len == 0) {
      pRVar3 = (Rep *)&nullrep_;
      goto LAB_0016df84;
    }
  }
  pRVar3 = (Rep *)operator_new__(len + 0x1b & 0xfffffffffffffffc);
  pRVar3->size = len;
  pRVar3->str[len] = '\0';
  pRVar3->capacity = len;
LAB_0016df84:
  memcpy(pRVar3->str,str,len);
  pRVar2 = this->rep_;
  this->rep_ = pRVar3;
  if (pRVar2 != (Rep *)0x0 && pRVar2 != (Rep *)&nullrep_) {
    operator_delete__(pRVar2);
  }
  return this;
}

Assistant:

TiXmlString& TiXmlString::assign(const char* str, size_type len) {
	size_type cap = capacity();
	if (len > cap || cap > 3 * (len + 8)) {
		TiXmlString tmp;
		tmp.init(len);
		memcpy(tmp.start(), str, len);
		swap(tmp);
	} else {
		memmove(start(), str, len);
		set_size(len);
	}
	return *this;
}